

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O0

int __thiscall cmValue::Compare(cmValue *this,cmValue value)

{
  string *psVar1;
  bool bVar2;
  cmValue *this_local;
  cmValue value_local;
  
  this_local = (cmValue *)value.Value;
  if ((this->Value == (string *)0x0) &&
     (bVar2 = operator_cast_to_bool((cmValue *)&this_local), !bVar2)) {
    return 0;
  }
  if (this->Value == (string *)0x0) {
    value_local.Value._4_4_ = -1;
  }
  else {
    bVar2 = operator_cast_to_bool((cmValue *)&this_local);
    if (bVar2) {
      psVar1 = this->Value;
      operator*[abi_cxx11_((cmValue *)&this_local);
      value_local.Value._4_4_ = std::__cxx11::string::compare((string *)psVar1);
    }
    else {
      value_local.Value._4_4_ = 1;
    }
  }
  return value_local.Value._4_4_;
}

Assistant:

int cmValue::Compare(cmValue value) const noexcept
{
  if (this->Value == nullptr && !value) {
    return 0;
  }
  if (this->Value == nullptr) {
    return -1;
  }
  if (!value) {
    return 1;
  }
  return this->Value->compare(*value);
}